

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer pPVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  TextureCube *this_00;
  ulong uVar5;
  long extraout_RAX;
  long lVar6;
  NotSupportedError *this_01;
  long lVar7;
  ulong uVar8;
  deUint32 step;
  RGBA local_6c;
  ulong local_68;
  long local_60;
  long local_58;
  string local_50;
  
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar3) + 0x20))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_00;
  uVar1 = this->m_size;
  if (uVar1 == 0) {
    uVar4 = 0x20;
  }
  else {
    uVar4 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar8 = 0;
  uVar5 = 0;
  if (0 < (int)(0x1f - uVar4)) {
    uVar5 = (ulong)(0x1f - uVar4);
  }
  lVar6 = uVar5 * 0x28 + 0x28;
  local_60 = lVar6;
  do {
    if (uVar1 != 0) {
      local_68 = uVar8 & 0xffffffff;
      local_58 = uVar8 * 3;
      lVar7 = 0;
      iVar3 = 0;
      do {
        if ((CubeFace)uVar8 < CUBEFACE_LAST) {
          iVar3 = (*(code *)(&DAT_01bf9960 + *(int *)(&DAT_01bf9960 + local_68 * 4)))();
          return iVar3;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar8,iVar3);
        pPVar2 = (&(this->m_texture->m_refTexture).m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_58];
        local_6c.m_value = 0xff000000;
        tcu::RGBA::toVec(&local_6c);
        tcu::clear((PixelBufferAccess *)
                   ((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + -8),
                   (Vec4 *)&local_50);
        iVar3 = iVar3 + 1;
        lVar7 = lVar7 + 0x28;
        lVar6 = extraout_RAX;
      } while (local_60 != lVar7);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  return (int)lVar6;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}